

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O0

void __thiscall
websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::
async_read_at_least(connection<websocketpp::config::asio_client::transport_config> *this,
                   size_t num_bytes,char *buf,size_t len,read_handler *handler)

{
  bool bVar1;
  element_type *peVar2;
  ostream *this_00;
  socket *s_00;
  element_type *this_01;
  undefined1 local_300 [32];
  undefined1 local_2e0 [136];
  wrapped_handler<boost::asio::io_context::strand,_websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_boost::system::error_code_&,_unsigned_long)>_>,_boost::asio::detail::is_continuation_if_running>
  local_258;
  undefined1 local_200 [24];
  string local_1e8 [48];
  stringstream local_1b8 [8];
  stringstream s;
  ostream local_1a8 [384];
  read_handler *handler_local;
  size_t len_local;
  char *buf_local;
  size_t num_bytes_local;
  connection<websocketpp::config::asio_client::transport_config> *this_local;
  
  local_1a8._376_8_ = handler;
  handler_local = (read_handler *)len;
  len_local = (size_t)buf;
  buf_local = (char *)num_bytes;
  num_bytes_local = (size_t)this;
  peVar2 = std::
           __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_alog);
  bVar1 = log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::static_test
                    (peVar2,0x400);
  if (bVar1) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    this_00 = std::operator<<(local_1a8,"asio async_read_at_least: ");
    std::ostream::operator<<(this_00,(ulong)buf_local);
    peVar2 = std::
             __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_alog);
    std::__cxx11::stringstream::str();
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (peVar2,0x400,local_1e8,len);
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  s_00 = basic_socket::connection::get_socket(&this->super_socket_con_type);
  local_200._8_16_ = (undefined1  [16])boost::asio::buffer((void *)len_local,(size_t)handler_local);
  local_200._0_8_ = boost::asio::transfer_at_least((size_t)buf_local);
  this_01 = std::
            __shared_ptr_access<boost::asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<boost::asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_strand);
  local_300._16_8_ = handle_async_read;
  local_300._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  get_shared((connection<websocketpp::config::asio_client::transport_config> *)local_300);
  std::
  bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*)(std::function<void(std::error_code_const&,unsigned_long)>,boost::system::error_code_const&,unsigned_long),std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>>,std::function<void(std::error_code_const&,unsigned_long)>&,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            ((type *)local_2e0,
             (offset_in_connection<websocketpp::config::asio_client::transport_config>_to_subr *)
             (local_300 + 0x10),
             (shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>
              *)local_300,handler,(_Placeholder<1> *)&std::placeholders::_1,
             (_Placeholder<2> *)&std::placeholders::_2);
  make_custom_alloc_handler<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>>,std::function<void(std::error_code_const&,unsigned_long)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&,unsigned_long)>,boost::system::error_code_const&,unsigned_long)>>
            ((custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_boost::system::error_code_&,_unsigned_long)>_>
              *)(local_2e0 + 0x40),(asio *)&this->m_read_handler_allocator,
             (handler_allocator *)local_2e0,
             (_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_boost::system::error_code_&,_unsigned_long)>
              *)handler);
  boost::asio::io_context::strand::
  wrap<websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>>,std::function<void(std::error_code_const&,unsigned_long)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&,unsigned_long)>,boost::system::error_code_const&,unsigned_long)>>>
            (&local_258,this_01,
             (custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_boost::system::error_code_&,_unsigned_long)>_>
              *)(local_2e0 + 0x40));
  boost::asio::
  async_read<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffers_1,boost::asio::detail::transfer_at_least_t,boost::asio::detail::wrapped_handler<boost::asio::io_context::strand,websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>>,std::function<void(std::error_code_const&,unsigned_long)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&,unsigned_long)>,boost::system::error_code_const&,unsigned_long)>>,boost::asio::detail::is_continuation_if_running>>
            (s_00,(mutable_buffers_1 *)(local_200 + 8),(transfer_at_least_t)local_200._0_8_,
             &local_258,(type *)0x0);
  boost::asio::detail::
  wrapped_handler<boost::asio::io_context::strand,_websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_boost::system::error_code_&,_unsigned_long)>_>,_boost::asio::detail::is_continuation_if_running>
  ::~wrapped_handler(&local_258);
  custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_boost::system::error_code_&,_unsigned_long)>_>
  ::~custom_alloc_handler
            ((custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_boost::system::error_code_&,_unsigned_long)>_>
              *)(local_2e0 + 0x40));
  std::
  _Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_boost::system::error_code_&,_unsigned_long)>
  ::~_Bind((_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_boost::system::error_code_&,_unsigned_long)>
            *)local_2e0);
  std::
  shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>
  ::~shared_ptr((shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>
                 *)local_300);
  return;
}

Assistant:

void async_read_at_least(size_t num_bytes, char *buf, size_t len,
        read_handler handler)
    {
        if (m_alog->static_test(log::alevel::devel)) {
            std::stringstream s;
            s << "asio async_read_at_least: " << num_bytes;
            m_alog->write(log::alevel::devel,s.str());
        }

        // TODO: safety vs speed ?
        // maybe move into an if devel block
        /*if (num_bytes > len) {
            m_elog->write(log::elevel::devel,
                "asio async_read_at_least error::invalid_num_bytes");
            handler(make_error_code(transport::error::invalid_num_bytes),
                size_t(0));
            return;
        }*/

        if (config::enable_multithreading) {
            lib::asio::async_read(
                socket_con_type::get_socket(),
                lib::asio::buffer(buf,len),
                lib::asio::transfer_at_least(num_bytes),
                m_strand->wrap(make_custom_alloc_handler(
                    m_read_handler_allocator,
                    lib::bind(
                        &type::handle_async_read, get_shared(),
                        handler,
                        lib::placeholders::_1, lib::placeholders::_2
                    )
                ))
            );
        } else {
            lib::asio::async_read(
                socket_con_type::get_socket(),
                lib::asio::buffer(buf,len),
                lib::asio::transfer_at_least(num_bytes),
                make_custom_alloc_handler(
                    m_read_handler_allocator,
                    lib::bind(
                        &type::handle_async_read, get_shared(),
                        handler,
                        lib::placeholders::_1, lib::placeholders::_2
                    )
                )
            );    
        }
        
    }